

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall
BlockFilterIndex::ReadFilterFromDisk
          (BlockFilterIndex *this,FlatFilePos *pos,uint256 *hash,BlockFilter *filter)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  FILE *flag;
  ConstevalFormatString<0U> in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  exception *e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter;
  AutoFile filein;
  uint256 block_hash;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  BlockFilter *in_stack_fffffffffffffdd0;
  BlockFilter *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffe00;
  FILE *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  undefined1 skip_decode_check;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *filter_00;
  int source_line;
  uint256 *in_stack_fffffffffffffe40;
  BlockFilterType in_stack_fffffffffffffe4f;
  BlockFilter *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  FlatFileSeq *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  byte bVar3;
  string_view in_stack_fffffffffffffe90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8 [4];
  Level in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_>::operator->
            ((unique_ptr<FlatFileSeq,_std::default_delete<FlatFileSeq>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  flag = FlatFileSeq::Open(in_stack_fffffffffffffe60,
                           (FlatFilePos *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
  local_f8[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filter_00 = local_f8;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  AutoFile::AutoFile((AutoFile *)
                     CONCAT17(in_stack_fffffffffffffe17,
                              CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
                     in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffdd8);
  bVar2 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                          );
  if (bVar2) {
    bVar3 = 0;
  }
  else {
    uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    AutoFile::operator>>((AutoFile *)in_stack_fffffffffffffdd8,(uint256 *)in_stack_fffffffffffffdd0)
    ;
    AutoFile::operator>>
              ((AutoFile *)in_stack_fffffffffffffdd8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar2 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffdd8,
                         (base_blob<256U> *)in_stack_fffffffffffffdd0);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      source_line = (int)((ulong)filter_00 >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      in_stack_fffffffffffffdc8 = 4;
      source_file._M_str._0_7_ = in_stack_fffffffffffffe88;
      source_file._M_len = in_RDI;
      source_file._M_str._7_1_ = in_stack_fffffffffffffe8f;
      LogPrintFormatInternal<>
                (in_stack_fffffffffffffe90,source_file,source_line,(LogFlags)flag,
                 in_stack_ffffffffffffff70,in_RSI);
    }
    else {
      GetFilterType((BlockFilterIndex *)
                    CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      skip_decode_check = (undefined1)((ulong)flag >> 0x38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xf7a9c4);
      BlockFilter::BlockFilter
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f,in_stack_fffffffffffffe40,
                 filter_00,(bool)skip_decode_check);
      BlockFilter::operator=(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      BlockFilter::~BlockFilter
                ((BlockFilter *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8)
      ;
    }
    bVar3 = !bVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8);
  }
  AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::ReadFilterFromDisk(const FlatFilePos& pos, const uint256& hash, BlockFilter& filter) const
{
    AutoFile filein{m_filter_fileseq->Open(pos, true)};
    if (filein.IsNull()) {
        return false;
    }

    // Check that the hash of the encoded_filter matches the one stored in the db.
    uint256 block_hash;
    std::vector<uint8_t> encoded_filter;
    try {
        filein >> block_hash >> encoded_filter;
        if (Hash(encoded_filter) != hash) {
            LogError("Checksum mismatch in filter decode.\n");
            return false;
        }
        filter = BlockFilter(GetFilterType(), block_hash, std::move(encoded_filter), /*skip_decode_check=*/true);
    }
    catch (const std::exception& e) {
        LogError("%s: Failed to deserialize block filter from disk: %s\n", __func__, e.what());
        return false;
    }

    return true;
}